

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsSecondDerivByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,double *outSumLogLikelihoodByPartition,
          double *outSumFirstDerivativeByPartition,double *outSumSecondDerivativeByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  double **ppdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  int *piVar28;
  double *pdVar29;
  double *pdVar30;
  double *pdVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  double *pdVar46;
  double *pdVar47;
  ulong uVar48;
  ulong uVar49;
  double __x;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  int local_10c;
  double local_100;
  long local_f8;
  double local_e0;
  
  if (0 < partitionCount) {
    uVar43 = 0;
    do {
      iVar14 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar43]];
      lVar44 = (long)iVar14;
      iVar15 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar43] + 1];
      lVar34 = (long)iVar15;
      iVar35 = iVar15 - iVar14;
      memset(this->integrationTmp + this->kStateCount * iVar14,0,
             (long)(this->kStateCount * iVar35) << 3);
      memset(this->firstDerivTmp + this->kStateCount * iVar14,0,
             (long)(this->kStateCount * iVar35) << 3);
      memset(this->secondDerivTmp + this->kStateCount * iVar14,0,
             (long)(iVar35 * this->kStateCount) << 3);
      iVar35 = childBufferIndices[uVar43];
      iVar16 = cumulativeScaleIndices[uVar43];
      ppdVar21 = this->gTransitionMatrices;
      pdVar22 = ppdVar21[probabilityIndices[uVar43]];
      pdVar23 = ppdVar21[firstDerivativeIndices[uVar43]];
      pdVar24 = ppdVar21[secondDerivativeIndices[uVar43]];
      pdVar25 = this->gCategoryWeights[categoryWeightsIndices[uVar43]];
      pdVar26 = this->gStateFrequencies[stateFrequenciesIndices[uVar43]];
      pdVar27 = this->gPartials[parentBufferIndices[uVar43]];
      if ((iVar35 < this->kTipCount) && (piVar28 = this->gTipStates[iVar35], piVar28 != (int *)0x0))
      {
        iVar35 = this->kCategoryCount;
        if (0 < (long)iVar35) {
          iVar17 = this->kPartialsPaddedStateCount;
          uVar18 = this->kStateCount;
          iVar19 = this->kMatrixSize;
          iVar20 = this->kPatternCount;
          iVar41 = iVar17 * iVar14;
          lVar37 = 0;
          local_10c = 0;
          do {
            if (iVar14 < iVar15) {
              auVar51._8_8_ = 0;
              auVar51._0_8_ = pdVar25[lVar37];
              pdVar47 = this->integrationTmp;
              pdVar29 = this->firstDerivTmp;
              pdVar30 = this->secondDerivTmp;
              iVar33 = this->kTransPaddedStateCount;
              lVar42 = (long)iVar41;
              pdVar46 = pdVar27 + lVar42;
              lVar40 = lVar44;
              iVar36 = uVar18 * iVar14;
              do {
                if (0 < (int)uVar18) {
                  lVar38 = (long)piVar28[lVar40] + (long)local_10c;
                  uVar45 = 0;
                  do {
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = pdVar47[(long)iVar36 + uVar45];
                    auVar57._8_8_ = 0;
                    auVar57._0_8_ = pdVar22[lVar38] * pdVar46[uVar45];
                    auVar52 = vfmadd213sd_fma(auVar57,auVar51,auVar1);
                    pdVar47[(long)iVar36 + uVar45] = auVar52._0_8_;
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = pdVar29[(long)iVar36 + uVar45];
                    auVar58._8_8_ = 0;
                    auVar58._0_8_ = pdVar23[lVar38] * pdVar46[uVar45];
                    auVar52 = vfmadd213sd_fma(auVar58,auVar51,auVar2);
                    pdVar29[(long)iVar36 + uVar45] = auVar52._0_8_;
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = pdVar30[(long)iVar36 + uVar45];
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = pdVar24[lVar38] * pdVar46[uVar45];
                    auVar52 = vfmadd213sd_fma(auVar59,auVar51,auVar3);
                    pdVar30[(long)iVar36 + uVar45] = auVar52._0_8_;
                    uVar45 = uVar45 + 1;
                    lVar38 = lVar38 + iVar33;
                  } while (uVar18 != uVar45);
                  iVar36 = iVar36 + (int)uVar45;
                }
                lVar42 = lVar42 + iVar17;
                iVar41 = (int)lVar42;
                lVar40 = lVar40 + 1;
                pdVar46 = pdVar46 + iVar17;
              } while (lVar40 != lVar34);
            }
            iVar41 = iVar41 + ((iVar14 - iVar15) + iVar20) * iVar17;
            lVar37 = lVar37 + 1;
            local_10c = local_10c + iVar19;
          } while (lVar37 != iVar35);
        }
      }
      else {
        iVar17 = this->kCategoryCount;
        if (0 < (long)iVar17) {
          pdVar46 = this->gPartials[iVar35];
          iVar35 = this->kPartialsPaddedStateCount;
          uVar18 = this->kStateCount;
          iVar19 = this->kMatrixSize;
          iVar20 = this->kPatternCount;
          uVar39 = iVar35 * iVar14;
          iVar41 = 0;
          local_f8 = 0;
          do {
            uVar45 = (ulong)uVar39;
            if (iVar14 < iVar15) {
              auVar52._8_8_ = 0;
              auVar52._0_8_ = pdVar25[local_f8];
              pdVar29 = this->integrationTmp;
              pdVar30 = this->firstDerivTmp;
              pdVar31 = this->secondDerivTmp;
              uVar45 = (ulong)(int)uVar39;
              pdVar47 = pdVar46 + uVar45;
              uVar49 = (ulong)(uVar18 * iVar14);
              iVar33 = iVar14;
              do {
                if (0 < (int)uVar18) {
                  uVar49 = (ulong)(int)uVar49;
                  uVar48 = 0;
                  iVar36 = iVar41;
                  do {
                    auVar51 = ZEXT816(0) << 0x40;
                    uVar32 = 0;
                    auVar66 = ZEXT816(0) << 0x40;
                    auVar61 = ZEXT816(0) << 0x40;
                    do {
                      auVar71._8_8_ = 0;
                      auVar71._0_8_ = pdVar47[uVar32];
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = pdVar22[(long)iVar36 + uVar32];
                      auVar61 = vfmadd231sd_fma(auVar61,auVar71,auVar4);
                      auVar5._8_8_ = 0;
                      auVar5._0_8_ = pdVar23[(long)iVar36 + uVar32];
                      auVar66 = vfmadd231sd_fma(auVar66,auVar71,auVar5);
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = pdVar24[(long)iVar36 + uVar32];
                      auVar51 = vfmadd231sd_fma(auVar51,auVar71,auVar6);
                      uVar32 = uVar32 + 1;
                    } while (uVar18 != uVar32);
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = pdVar29[uVar49];
                    auVar69._8_8_ = 0;
                    auVar69._0_8_ = auVar61._0_8_ * pdVar27[uVar45 + uVar48];
                    auVar61 = vfmadd213sd_fma(auVar69,auVar52,auVar7);
                    pdVar29[uVar49] = auVar61._0_8_;
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = pdVar30[uVar49];
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = auVar66._0_8_ * pdVar27[uVar45 + uVar48];
                    auVar61 = vfmadd213sd_fma(auVar67,auVar52,auVar61);
                    pdVar30[uVar49] = auVar61._0_8_;
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = pdVar31[uVar49];
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = auVar51._0_8_ * pdVar27[uVar45 + uVar48];
                    auVar61 = vfmadd213sd_fma(auVar60,auVar52,auVar66);
                    pdVar31[uVar49] = auVar61._0_8_;
                    uVar49 = uVar49 + 1;
                    uVar48 = uVar48 + 1;
                    iVar36 = iVar36 + uVar18 + 1;
                  } while (uVar48 != uVar18);
                }
                uVar45 = uVar45 + (long)iVar35;
                iVar33 = iVar33 + 1;
                pdVar47 = pdVar47 + iVar35;
              } while (iVar33 != iVar15);
            }
            uVar39 = (int)uVar45 + ((iVar14 - iVar15) + iVar20) * iVar35;
            local_f8 = local_f8 + 1;
            iVar41 = iVar41 + iVar19;
          } while (local_f8 != iVar17);
        }
      }
      if (iVar14 < iVar15) {
        iVar35 = this->kStateCount * iVar14;
        lVar37 = lVar44;
        do {
          iVar17 = this->kStateCount;
          if ((long)iVar17 < 1) {
            __x = 0.0;
            local_100 = 0.0;
            local_e0 = 0.0;
          }
          else {
            auVar61 = ZEXT816(0);
            lVar40 = 0;
            auVar70 = ZEXT864(0) << 0x40;
            auVar52 = ZEXT816(0);
            do {
              auVar68._8_8_ = 0;
              auVar68._0_8_ = pdVar26[lVar40];
              auVar8._8_8_ = 0;
              auVar8._0_8_ = this->integrationTmp[iVar35 + lVar40];
              auVar52 = vfmadd231sd_fma(auVar52,auVar68,auVar8);
              __x = auVar52._0_8_;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = this->firstDerivTmp[iVar35 + lVar40];
              auVar66 = vfmadd231sd_fma(auVar70._0_16_,auVar68,auVar9);
              auVar70 = ZEXT1664(auVar66);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = this->secondDerivTmp[iVar35 + lVar40];
              auVar61 = vfmadd231sd_fma(auVar61,auVar68,auVar10);
              lVar40 = lVar40 + 1;
            } while (iVar17 != lVar40);
            iVar35 = iVar35 + iVar17;
            local_e0 = auVar61._0_8_;
            local_100 = auVar66._0_8_;
          }
          dVar50 = log(__x);
          this->outLogLikelihoodsTmp[lVar37] = dVar50;
          auVar53._0_8_ = local_100 / __x;
          auVar53._8_8_ = 0;
          this->outFirstDerivativesTmp[lVar37] = auVar53._0_8_;
          auVar62._0_8_ = local_e0 / __x;
          auVar62._8_8_ = 0;
          auVar52 = vfnmadd231sd_fma(auVar62,auVar53,auVar53);
          this->outSecondDerivativesTmp[lVar37] = auVar52._0_8_;
          lVar37 = lVar37 + 1;
        } while (lVar37 != lVar34);
      }
      if ((iVar16 != -1) && (iVar14 < iVar15)) {
        pdVar22 = this->gScaleBuffers[iVar16];
        pdVar23 = this->outLogLikelihoodsTmp;
        lVar37 = lVar44;
        do {
          pdVar23[lVar37] = pdVar22[lVar37] + pdVar23[lVar37];
          lVar37 = lVar37 + 1;
        } while (lVar34 != lVar37);
      }
      outSumLogLikelihoodByPartition[uVar43] = 0.0;
      outSumFirstDerivativeByPartition[uVar43] = 0.0;
      outSumSecondDerivativeByPartition[uVar43] = 0.0;
      if (iVar14 < iVar15) {
        pdVar22 = this->gPatternWeights;
        pdVar23 = this->outLogLikelihoodsTmp;
        pdVar24 = this->outFirstDerivativesTmp;
        pdVar25 = this->outSecondDerivativesTmp;
        do {
          auVar54._8_8_ = 0;
          auVar54._0_8_ = pdVar23[lVar44];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = pdVar22[lVar44];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = outSumLogLikelihoodByPartition[uVar43];
          auVar52 = vfmadd213sd_fma(auVar63,auVar54,auVar11);
          outSumLogLikelihoodByPartition[uVar43] = auVar52._0_8_;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = pdVar24[lVar44];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = pdVar22[lVar44];
          auVar12._8_8_ = 0;
          auVar12._0_8_ = outSumFirstDerivativeByPartition[uVar43];
          auVar52 = vfmadd213sd_fma(auVar64,auVar55,auVar12);
          outSumFirstDerivativeByPartition[uVar43] = auVar52._0_8_;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = pdVar25[lVar44];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = pdVar22[lVar44];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = outSumSecondDerivativeByPartition[uVar43];
          auVar52 = vfmadd213sd_fma(auVar65,auVar56,auVar13);
          outSumSecondDerivativeByPartition[uVar43] = auVar52._0_8_;
          lVar44 = lVar44 + 1;
        } while (lVar34 != lVar44);
      }
      uVar43 = uVar43 + 1;
    } while (uVar43 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* firstDerivativeIndices,
                                                  const int* secondDerivativeIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition,
                                                  double* outSumFirstDerivativeByPartition,
                                                  double* outSumSecondDerivativeByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&firstDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&secondDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int firstDerivativeIndex = firstDerivativeIndices[p];
        const int secondDerivativeIndex = secondDerivativeIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
        const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child

            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJ = 0.0;
                        double sumOverJD1 = 0.0;
                        double sumOverJD2 = 0.0;
                        for(int j = 0; j < kStateCount; j++) {
                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                            sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                            sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                            w++;
                        }

                        // increment for the extra column at the end
                        w += T_PAD;

                        integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                        u++;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            REALTYPE sumOverID1 = 0.0;
            REALTYPE sumOverID2 = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                sumOverID1 += freqs[i] * firstDerivTmp[u];
                sumOverID2 += freqs[i] * secondDerivTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
            outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
            outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }


        outSumLogLikelihoodByPartition[p] = 0.0;
        outSumFirstDerivativeByPartition[p] = 0.0;
        outSumSecondDerivativeByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p]    += outLogLikelihoodsTmp[i]    * gPatternWeights[i];
            outSumFirstDerivativeByPartition[p]  += outFirstDerivativesTmp[i]  * gPatternWeights[i];
            outSumSecondDerivativeByPartition[p] += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }

    }
}